

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,REF_DBL *scalar,REF_DBL *grad)

{
  double dVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_INT RVar4;
  REF_INT RVar5;
  REF_STATUS RVar6;
  uint uVar7;
  uint uVar8;
  void *__ptr;
  long lVar9;
  REF_CELL *ppRVar10;
  REF_DBL *pRVar11;
  long lVar12;
  undefined8 uVar13;
  long lVar14;
  REF_CELL ref_cell;
  char *pcVar15;
  int iVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  REF_DBL cell_vol;
  REF_DBL *local_190;
  REF_NODE local_188;
  REF_INT local_180;
  REF_INT local_17c;
  REF_DBL cell_grad [3];
  REF_BOOL div_by_zero;
  REF_CELL local_150;
  REF_INT qua_nodes [27];
  REF_INT local_c8 [4];
  REF_INT RStack_b8;
  REF_INT RStack_b4;
  REF_INT local_b0;
  REF_INT local_ac;
  undefined8 local_58;
  undefined8 uStack_50;
  REF_CELL *local_40;
  long local_38;
  
  local_188 = ref_grid->node;
  lVar14 = (long)local_188->max;
  local_190 = scalar;
  if (lVar14 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
           "ref_recon_l2_projection_grad","malloc vol of REF_DBL negative");
    uVar7 = 1;
  }
  else {
    __ptr = malloc(lVar14 * 8);
    pRVar3 = local_188;
    if (__ptr == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x34,
             "ref_recon_l2_projection_grad","malloc vol of REF_DBL NULL");
      uVar7 = 2;
    }
    else {
      for (lVar9 = 0; lVar14 != lVar9; lVar9 = lVar9 + 1) {
        *(undefined8 *)((long)__ptr + lVar9 * 8) = 0;
      }
      pRVar11 = grad;
      for (lVar9 = 0; lVar9 != lVar14; lVar9 = lVar9 + 1) {
        if (-1 < local_188->global[lVar9]) {
          for (lVar12 = 0; lVar12 != 3; lVar12 = lVar12 + 1) {
            pRVar11[lVar12] = 0.0;
          }
        }
        pRVar11 = pRVar11 + 3;
      }
      if (ref_grid->twod == 0) {
        local_40 = ref_grid->cell;
        ppRVar10 = ref_grid->cell + 8;
        lVar14 = 8;
        while (lVar14 != 0x10) {
          ref_cell = *ppRVar10;
          local_150 = ref_cell;
          local_38 = lVar14;
          for (iVar16 = 0; iVar16 < ref_cell->max; iVar16 = iVar16 + 1) {
            RVar6 = ref_cell_nodes(ref_cell,iVar16,local_c8);
            RVar5 = RStack_b8;
            RVar4 = local_c8[3];
            pRVar3 = local_188;
            if (RVar6 == 0) {
              switch(ref_cell->type) {
              case REF_CELL_EDG:
              case REF_CELL_ED2:
              case REF_CELL_ED3:
              case REF_CELL_TRI:
              case REF_CELL_TR2:
              case REF_CELL_TR3:
              case REF_CELL_QUA:
              case REF_CELL_QU2:
              case REF_CELL_TE2:
              case REF_CELL_PY2:
              case REF_CELL_PR2:
              case REF_CELL_HE2:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x15c,"ref_recon_l2_projection_grad",6,"implement cell type");
                printf("unknown type %d\n",(ulong)ref_cell->type);
                return 6;
              case REF_CELL_TET:
                uVar7 = ref_node_tet_vol(local_188,local_c8,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,local_c8,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = local_c8[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x7b,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                break;
              case REF_CELL_PYR:
                qua_nodes[0] = local_c8[0];
                qua_nodes[1] = RStack_b8;
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xc3,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                pRVar3 = local_188;
                qua_nodes[0] = local_c8[0];
                qua_nodes[1] = local_c8[3];
                qua_nodes[2] = RStack_b8;
                qua_nodes[3] = local_c8[2];
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; ref_cell = local_150, lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  uVar13 = 0xd4;
LAB_001b94cf:
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,uVar13,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                  ref_cell = local_150;
                }
                break;
              case REF_CELL_PRI:
                qua_nodes[0] = local_c8[0];
                qua_nodes[3] = local_c8[3];
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x8e,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                pRVar3 = local_188;
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x9f,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                pRVar3 = local_188;
                qua_nodes[0] = local_c8[0];
                qua_nodes[1] = local_c8[1];
                qua_nodes[2] = local_c8[2];
                qua_nodes[3] = RStack_b4;
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 != 0 || uVar8 != 0) {
                  uVar13 = 0xb0;
                  goto LAB_001b94cf;
                }
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  iVar2 = qua_nodes[lVar14];
                  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                    grad[iVar2 * 3 + lVar9] = cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                  }
                }
                for (lVar14 = 0; ref_cell = local_150, lVar14 != 4; lVar14 = lVar14 + 1) {
                  *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                       *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                }
                break;
              case REF_CELL_HEX:
                local_17c = local_c8[0];
                local_58 = CONCAT44(local_58._4_4_,local_c8[1]);
                qua_nodes[0] = local_c8[1];
                qua_nodes[1] = local_c8[3];
                local_180 = local_ac;
                qua_nodes[2] = local_ac;
                qua_nodes[3] = local_c8[2];
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0xef,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                pRVar3 = local_188;
                qua_nodes[0] = (REF_INT)local_58;
                qua_nodes[1] = local_17c;
                qua_nodes[2] = local_180;
                qua_nodes[3] = RVar4;
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x100,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                qua_nodes[0] = (REF_INT)local_58;
                qua_nodes[1] = local_17c;
                qua_nodes[2] = RVar5;
                qua_nodes[3] = local_180;
                uVar7 = ref_node_tet_vol(pRVar3,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x111,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                RVar4 = local_ac;
                local_17c = local_c8[1];
                local_58 = CONCAT44(RStack_b4,RStack_b8);
                uStack_50 = 0;
                qua_nodes[1] = local_ac;
                local_180 = local_b0;
                qua_nodes[2] = local_b0;
                qua_nodes[3] = local_c8[2];
                uVar7 = ref_node_tet_vol(pRVar3,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x129,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                pRVar3 = local_188;
                qua_nodes[0] = local_17c;
                qua_nodes[1] = (REF_INT)local_58;
                qua_nodes[2] = local_180;
                qua_nodes[3] = RVar4;
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 == 0 && uVar8 == 0) {
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    iVar2 = qua_nodes[lVar14];
                    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                      grad[iVar2 * 3 + lVar9] =
                           cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                    }
                  }
                  for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                    *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                         *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                  }
                }
                else {
                  printf("%s: %d: %s: vol status %d grad status %d\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x13a,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
                }
                pRVar3 = local_188;
                qua_nodes[0] = local_17c;
                qua_nodes[1] = (REF_INT)local_58;
                qua_nodes[2] = (REF_INT)((ulong)local_58 >> 0x20);
                qua_nodes[3] = local_180;
                uVar7 = ref_node_tet_vol(local_188,qua_nodes,&cell_vol);
                uVar8 = ref_node_tet_grad_nodes(pRVar3,qua_nodes,local_190,cell_grad);
                if (uVar7 != 0 || uVar8 != 0) {
                  uVar13 = 0x14b;
                  goto LAB_001b94cf;
                }
                for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
                  iVar2 = qua_nodes[lVar14];
                  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                    grad[iVar2 * 3 + lVar9] = cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                  }
                }
                for (lVar14 = 0; ref_cell = local_150, lVar14 != 4; lVar14 = lVar14 + 1) {
                  *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) =
                       *(double *)((long)__ptr + (long)qua_nodes[lVar14] * 8) + cell_vol;
                }
              }
            }
          }
          ppRVar10 = local_40 + local_38 + 1;
          lVar14 = local_38 + 1;
        }
      }
      else {
        for (iVar16 = 0; iVar16 < ref_grid->cell[3]->max; iVar16 = iVar16 + 1) {
          RVar6 = ref_cell_nodes(ref_grid->cell[3],iVar16,local_c8);
          if (RVar6 == 0) {
            uVar7 = ref_node_tri_area(pRVar3,local_c8,&cell_vol);
            uVar8 = ref_node_tri_grad_nodes(pRVar3,local_c8,local_190,cell_grad);
            if (uVar7 == 0 && uVar8 == 0) {
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                iVar2 = local_c8[lVar14];
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  grad[iVar2 * 3 + lVar9] = cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                }
              }
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) =
                     *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) + cell_vol;
              }
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x44,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
            }
          }
        }
        iVar16 = 0;
        while( true ) {
          if (ref_grid->cell[6]->max <= iVar16) break;
          RVar6 = ref_cell_nodes(ref_grid->cell[6],iVar16,qua_nodes);
          if (RVar6 == 0) {
            local_c8[2] = qua_nodes[2];
            local_c8[3] = qua_nodes[4];
            uVar7 = ref_node_tri_area(pRVar3,local_c8,&cell_vol);
            uVar8 = ref_node_tri_grad_nodes(pRVar3,local_c8,local_190,cell_grad);
            if (uVar7 == 0 && uVar8 == 0) {
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                iVar2 = local_c8[lVar14];
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  grad[iVar2 * 3 + lVar9] = cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                }
              }
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) =
                     *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) + cell_vol;
              }
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x57,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
            }
            local_c8[0] = qua_nodes[0];
            local_c8[3] = qua_nodes[4];
            uVar7 = ref_node_tri_area(pRVar3,local_c8,&cell_vol);
            uVar8 = ref_node_tri_grad_nodes(pRVar3,local_c8,local_190,cell_grad);
            if (uVar7 == 0 && uVar8 == 0) {
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                iVar2 = local_c8[lVar14];
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  grad[iVar2 * 3 + lVar9] = cell_grad[lVar9] * cell_vol + grad[iVar2 * 3 + lVar9];
                }
              }
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) =
                     *(double *)((long)__ptr + (long)local_c8[lVar14] * 8) + cell_vol;
              }
            }
            else {
              printf("%s: %d: %s: vol status %d grad status %d\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x67,"ref_recon_l2_projection_grad",(ulong)uVar7,(ulong)uVar8);
            }
          }
          iVar16 = iVar16 + 1;
        }
      }
      div_by_zero = 0;
      pRVar11 = grad;
      for (lVar14 = 0; lVar14 < local_188->max; lVar14 = lVar14 + 1) {
        if (-1 < local_188->global[lVar14]) {
          dVar1 = *(double *)((long)__ptr + lVar14 * 8);
          auVar18._0_8_ = dVar1 * 1e+20;
          auVar18._8_8_ = grad[lVar14 * 3];
          auVar19._8_8_ = -grad[lVar14 * 3];
          auVar19._0_8_ = -auVar18._0_8_;
          auVar19 = maxpd(auVar18,auVar19);
          dVar17 = auVar19._0_8_;
          if (auVar19._8_8_ < dVar17) {
            dVar20 = grad[lVar14 * 3 + 1];
            if (dVar20 <= -dVar20) {
              dVar20 = -dVar20;
            }
            if (dVar20 < dVar17) {
              dVar20 = grad[lVar14 * 3 + 2];
              if (dVar20 <= -dVar20) {
                dVar20 = -dVar20;
              }
              if (dVar20 < dVar17) {
                for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
                  pRVar11[lVar9] = pRVar11[lVar9] / dVar1;
                }
                goto LAB_001b9696;
              }
            }
          }
          div_by_zero = 1;
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            pRVar11[lVar9] = 0.0;
          }
          printf("%s: %d: %s: total vol %e, ignored\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x16b,"ref_recon_l2_projection_grad");
        }
LAB_001b9696:
        pRVar11 = pRVar11 + 3;
      }
      uVar7 = ref_mpi_all_or(ref_grid->mpi,&div_by_zero);
      if (uVar7 == 0) {
        uVar7 = ref_node_ghost_dbl(local_188,grad,3);
        if (uVar7 == 0) {
          free(__ptr);
          return (uint)(div_by_zero != 0) << 2;
        }
        pcVar15 = "update ghosts";
        uVar13 = 0x170;
      }
      else {
        pcVar15 = "mpi all or";
        uVar13 = 0x16f;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
             uVar13,"ref_recon_l2_projection_grad",(ulong)uVar7,pcVar15);
    }
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_recon_l2_projection_grad(REF_GRID ref_grid,
                                                REF_DBL *scalar,
                                                REF_DBL *grad) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT i, node, cell, group, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER], tet_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT qua_nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL div_by_zero;
  REF_DBL cell_vol, cell_grad[3];
  REF_DBL *vol;
  REF_STATUS vol_status, grad_status;

  ref_malloc_init(vol, ref_node_max(ref_node), REF_DBL, 0.0);

  each_ref_node_valid_node(ref_node, node) for (i = 0; i < 3; i++)
      grad[i + 3 * node] = 0.0;

  if (ref_grid_twod(ref_grid)) {
    each_ref_cell_valid_cell_with_nodes(ref_grid_tri(ref_grid), cell, nodes) {
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
    each_ref_cell_valid_cell_with_nodes(ref_grid_qua(ref_grid), cell,
                                        qua_nodes) {
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[1];
      nodes[2] = qua_nodes[2];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
      nodes[0] = qua_nodes[0];
      nodes[1] = qua_nodes[2];
      nodes[2] = qua_nodes[3];
      nodes[3] = qua_nodes[4];
      vol_status = ref_node_tri_area(ref_node, nodes, &cell_vol);
      grad_status = ref_node_tri_grad_nodes(ref_node, nodes, scalar, cell_grad);
      if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
        for (cell_node = 0; cell_node < 3; cell_node++)
          for (i = 0; i < 3; i++)
            grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
        for (cell_node = 0; cell_node < 3; cell_node++)
          vol[nodes[cell_node]] += cell_vol;
      } else {
        printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__, __LINE__,
               __func__, vol_status, grad_status);
      }
    }
  } else {
    each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
      each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
        switch (ref_cell_type(ref_cell)) {
          case REF_CELL_TET:
            vol_status = ref_node_tet_vol(ref_node, nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PRI:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[5];
            tet_nodes[3] = nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[1];
            tet_nodes[2] = nodes[2];
            tet_nodes[3] = nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_PYR:
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[4];
            tet_nodes[2] = nodes[1];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = nodes[0];
            tet_nodes[1] = nodes[3];
            tet_nodes[2] = nodes[4];
            tet_nodes[3] = nodes[2];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            break;
          case REF_CELL_HEX:

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[0];
            pri_nodes[2] = nodes[4];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[3];
            pri_nodes[5] = nodes[7];

            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            pri_nodes[0] = nodes[1];
            pri_nodes[1] = nodes[4];
            pri_nodes[2] = nodes[5];
            pri_nodes[3] = nodes[2];
            pri_nodes[4] = nodes[7];
            pri_nodes[5] = nodes[6];

            tet_nodes[1] = pri_nodes[4];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[3];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[5];
            tet_nodes[3] = pri_nodes[4];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }
            tet_nodes[0] = pri_nodes[0];
            tet_nodes[1] = pri_nodes[1];
            tet_nodes[2] = pri_nodes[2];
            tet_nodes[3] = pri_nodes[5];
            vol_status = ref_node_tet_vol(ref_node, tet_nodes, &cell_vol);
            grad_status =
                ref_node_tet_grad_nodes(ref_node, tet_nodes, scalar, cell_grad);
            if (REF_SUCCESS == vol_status && REF_SUCCESS == grad_status) {
              for (cell_node = 0; cell_node < 4; cell_node++)
                for (i = 0; i < 3; i++)
                  grad[i + 3 * tet_nodes[cell_node]] += cell_vol * cell_grad[i];
              for (cell_node = 0; cell_node < 4; cell_node++)
                vol[tet_nodes[cell_node]] += cell_vol;
            } else {
              printf("%s: %d: %s: vol status %d grad status %d\n", __FILE__,
                     __LINE__, __func__, vol_status, grad_status);
            }

            break;
          case REF_CELL_EDG:
          case REF_CELL_ED2:
          case REF_CELL_ED3:
          case REF_CELL_TRI:
          case REF_CELL_TR2:
          case REF_CELL_TR3:
          case REF_CELL_QUA:
          case REF_CELL_QU2:
          case REF_CELL_TE2:
          case REF_CELL_PY2:
          case REF_CELL_PR2:
          case REF_CELL_HE2:
            RSB(REF_IMPLEMENT, "implement cell type",
                { printf("unknown type %d\n", (int)ref_cell_type(ref_cell)); });
        }
      }
    }
  }

  div_by_zero = REF_FALSE;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_math_divisible(grad[0 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[1 + 3 * node], vol[node]) &&
        ref_math_divisible(grad[2 + 3 * node], vol[node])) {
      for (i = 0; i < 3; i++) grad[i + 3 * node] /= vol[node];
    } else {
      div_by_zero = REF_TRUE;
      for (i = 0; i < 3; i++) grad[i + 3 * node] = 0.0;
      printf("%s: %d: %s: total vol %e, ignored\n", __FILE__, __LINE__,
             __func__, vol[node]);
    }
  }
  RSS(ref_mpi_all_or(ref_grid_mpi(ref_grid), &div_by_zero), "mpi all or");
  RSS(ref_node_ghost_dbl(ref_node, grad, 3), "update ghosts");

  ref_free(vol);

  return (div_by_zero ? REF_DIV_ZERO : REF_SUCCESS);
}